

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSModuleDef * js_host_resolve_imported_module(JSContext *ctx,char *base_cname,char *cname1)

{
  JSAtom name;
  char *in_RDX;
  JSContext *in_RSI;
  JSContext *in_RDI;
  JSValue JVar1;
  JSAtom module_name;
  char *cname;
  JSModuleDef *m;
  JSRuntime *rt;
  undefined4 in_stack_ffffffffffffffa8;
  JSAtom in_stack_ffffffffffffffac;
  JSContext *ctx_00;
  undefined1 in_stack_ffffffffffffffb0 [16];
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  char *local_38;
  JSRuntime *name_00;
  JSModuleDef *local_8;
  
  name_00 = in_RDI->rt;
  if (name_00->module_normalize_func == (JSModuleNormalizeFunc *)0x0) {
    local_38 = js_default_module_normalize_name(in_RSI,in_RDX,(char *)name_00);
  }
  else {
    local_38 = (*name_00->module_normalize_func)
                         (in_RDI,(char *)in_RSI,in_RDX,name_00->module_loader_opaque);
  }
  ctx_00 = in_stack_ffffffffffffffb0._0_8_;
  if (local_38 == (char *)0x0) {
    local_8 = (JSModuleDef *)0x0;
  }
  else {
    name = JS_NewAtom((JSContext *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                      in_stack_ffffffffffffffb0._8_8_);
    if (name == 0) {
      js_free(ctx_00,(void *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      local_8 = (JSModuleDef *)0x0;
    }
    else {
      local_8 = js_find_loaded_module(in_RDI,name);
      if (local_8 == (JSModuleDef *)0x0) {
        JS_FreeAtom(ctx_00,in_stack_ffffffffffffffac);
        if (name_00->module_loader_func == (JSModuleLoaderFunc *)0x0) {
          JVar1 = JS_ThrowReferenceError(in_RDI,"could not load module \'%s\'",local_38);
          js_free((JSContext *)JVar1.u.ptr,
                  (void *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
          local_8 = (JSModuleDef *)0x0;
        }
        else {
          local_8 = (*name_00->module_loader_func)(in_RDI,local_38,name_00->module_loader_opaque);
          js_free(ctx_00,(void *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
        }
      }
      else {
        js_free(ctx_00,(void *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
        JS_FreeAtom(ctx_00,in_stack_ffffffffffffffac);
      }
    }
  }
  return local_8;
}

Assistant:

static JSModuleDef *js_host_resolve_imported_module(JSContext *ctx,
                                                    const char *base_cname,
                                                    const char *cname1)
{
    JSRuntime *rt = ctx->rt;
    JSModuleDef *m;
    char *cname;
    JSAtom module_name;

    if (!rt->module_normalize_func) {
        cname = js_default_module_normalize_name(ctx, base_cname, cname1);
    } else {
        cname = rt->module_normalize_func(ctx, base_cname, cname1,
                                          rt->module_loader_opaque);
    }
    if (!cname)
        return NULL;

    module_name = JS_NewAtom(ctx, cname);
    if (module_name == JS_ATOM_NULL) {
        js_free(ctx, cname);
        return NULL;
    }

    /* first look at the loaded modules */
    m = js_find_loaded_module(ctx, module_name);
    if (m) {
        js_free(ctx, cname);
        JS_FreeAtom(ctx, module_name);
        return m;
    }

    JS_FreeAtom(ctx, module_name);

    /* load the module */
    if (!rt->module_loader_func) {
        /* XXX: use a syntax error ? */
        JS_ThrowReferenceError(ctx, "could not load module '%s'",
                               cname);
        js_free(ctx, cname);
        return NULL;
    }

    m = rt->module_loader_func(ctx, cname, rt->module_loader_opaque);
    js_free(ctx, cname);
    return m;
}